

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Image.cpp
# Opt level: O2

void __thiscall sfc::Image::Image(Image *this,string *path)

{
  channel_vec_t *out;
  _Rb_tree_header *p_Var1;
  pointer puVar2;
  LodePNGColorType LVar3;
  uint uVar4;
  runtime_error *prVar5;
  char *pcVar6;
  ulong uVar7;
  byte bVar8;
  int iVar9;
  bool bVar10;
  uint h;
  uint w;
  rgba_set_t *local_2b8;
  rgba_vec_t rgba_v;
  byte_vec_t buffer;
  uint32_t color;
  State state;
  
  out = &this->_data;
  (this->_colors)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->_colors)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_2b8 = &this->_colors;
  p_Var1 = &(this->_colors)._M_t._M_impl.super__Rb_tree_header;
  (this->_data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_indexed_data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_palette).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_indexed_data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_indexed_data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_palette).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_palette).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_colors)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->_colors)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->_colors)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar4 = lodepng::load_file(&buffer,path);
  if (uVar4 != 0) {
    prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
    pcVar6 = lodepng_error_text(uVar4);
    std::runtime_error::runtime_error(prVar5,pcVar6);
    __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  lodepng::State::State(&state);
  state.super_LodePNGState.decoder.color_convert = 0;
  state.super_LodePNGState.decoder.ignore_crc = 1;
  uVar4 = lodepng::decode(out,&w,&h,&state,&buffer);
  LVar3 = state.super_LodePNGState.info_raw.colortype;
  if (uVar4 != 0) {
    prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
    pcVar6 = lodepng_error_text(uVar4);
    std::runtime_error::runtime_error(prVar5,pcVar6);
    __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if (state.super_LodePNGState.info_raw.colortype == LCT_PALETTE) {
    if (state.super_LodePNGState.info_raw.bitdepth - 1 < 7) {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&color,(ulong)(h * w),
                 (allocator_type *)&rgba_v);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
                (&this->_indexed_data,
                 (_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&color);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&color);
      bVar8 = 0;
      uVar4 = state.super_LodePNGState.info_raw.bitdepth;
      while (bVar10 = uVar4 != 0, uVar4 = uVar4 - 1, bVar10) {
        bVar8 = bVar8 * '\x02' + 1;
      }
      iVar9 = 0;
      uVar4 = 0;
      while( true ) {
        uVar7 = (ulong)uVar4;
        puVar2 = (this->_indexed_data).
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start;
        if ((ulong)((long)(this->_indexed_data).
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_finish - (long)puVar2) <= uVar7) break;
        puVar2[uVar7] =
             (out->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_start
             [uVar7 / (8 / (ulong)state.super_LodePNGState.info_raw.bitdepth)] >>
             (8 - (((byte)iVar9 & 7) + (char)state.super_LodePNGState.info_raw.bitdepth) & 0x1f) &
             bVar8;
        uVar4 = uVar4 + 1;
        iVar9 = iVar9 + state.super_LodePNGState.info_raw.bitdepth;
      }
    }
    else {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                (&this->_indexed_data,out);
    }
    for (uVar4 = 3; (ulong)(uVar4 - 3) < state.super_LodePNGState.info_raw.palettesize << 2;
        uVar4 = uVar4 + 4) {
      color = CONCAT13(state.super_LodePNGState.info_raw.palette[uVar4],
                       CONCAT12(state.super_LodePNGState.info_raw.palette[uVar4 - 1],
                                CONCAT11(state.super_LodePNGState.info_raw.palette[uVar4 - 2],
                                         state.super_LodePNGState.info_raw.palette[uVar4 - 3])));
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(&this->_palette,&color);
    }
    state.super_LodePNGState.info_raw.colortype = LCT_RGBA;
  }
  if ((state.super_LodePNGState.info_png.color.colortype < 5) &&
     ((0x15U >> (state.super_LodePNGState.info_png.color.colortype & 0x1f) & 1) != 0)) {
    state.super_LodePNGState.info_raw.colortype = LCT_RGBA;
    if (state.super_LodePNGState.info_png.color.bitdepth != 8) {
LAB_0012cdb0:
      state.super_LodePNGState.info_raw.bitdepth = 8;
    }
  }
  else {
    if (state.super_LodePNGState.info_png.color.bitdepth != 8) goto LAB_0012cdb0;
    if (LVar3 != LCT_PALETTE) goto LAB_0012cdf6;
  }
  puVar2 = (this->_data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->_data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish != puVar2) {
    (this->_data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar2;
  }
  state.super_LodePNGState.decoder.color_convert = 1;
  uVar4 = lodepng::decode(out,&w,&h,&state,&buffer);
  if (uVar4 != 0) {
    prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
    pcVar6 = lodepng_error_text(uVar4);
    std::runtime_error::runtime_error(prVar5,pcVar6);
    __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
LAB_0012cdf6:
  this->_width = w;
  this->_height = h;
  this->_src_coord_x = 0;
  this->_src_coord_y = 0;
  to_rgba(&rgba_v,out);
  std::set<unsigned_int,std::less<unsigned_int>,std::allocator<unsigned_int>>::
  set<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>>
            ((set<unsigned_int,std::less<unsigned_int>,std::allocator<unsigned_int>> *)&color,
             (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
              )rgba_v.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start,
             (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
              )rgba_v.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish);
  std::
  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  ::operator=(&local_2b8->_M_t,
              (_Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
               *)&color);
  std::
  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  ::~_Rb_tree((_Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
               *)&color);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            (&rgba_v.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  lodepng::State::~State(&state);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  return;
}

Assistant:

Image::Image(const std::string& path) {
  byte_vec_t buffer;
  unsigned w, h;

  unsigned error = lodepng::load_file(buffer, path);
  if (error)
    throw std::runtime_error(lodepng_error_text(error));

  lodepng::State state;
  state.decoder.color_convert = false;
  state.decoder.ignore_crc = true;

  error = lodepng::decode(_data, w, h, state, buffer);
  if (error)
    throw std::runtime_error(lodepng_error_text(error));

  bool needs_conversion = false;

  if (state.info_raw.colortype == LCT_PALETTE) {
    if (state.info_raw.bitdepth && state.info_raw.bitdepth < 8) {
      // unpack 2/4 bit data
      _indexed_data = index_vec_t(w * h);
      unsigned depth = state.info_raw.bitdepth;
      unsigned ppb = 8 / state.info_raw.bitdepth;
      index_t mask = 0;
      for (unsigned i = 0; i < depth; ++i)
        mask = (mask << 1) + 1;

      for (unsigned i = 0; i < _indexed_data.size(); ++i) {
        unsigned pack_shift = 8 - depth - ((i * depth) % 8);
        _indexed_data[i] = mask & (_data[i / ppb] >> pack_shift);
      }

    } else {
      _indexed_data = _data;
    }

    for (unsigned i = 0; i < state.info_raw.palettesize * 4; i += 4) {
      uint32_t color = (state.info_raw.palette[i]) + (state.info_raw.palette[i + 1] << 8) +
                       (state.info_raw.palette[i + 2] << 16) + (state.info_raw.palette[i + 3] << 24);
      _palette.push_back(color);
    }

    needs_conversion = true;
    state.info_raw.colortype = LCT_RGBA;
  }

  if (state.info_png.color.colortype == LCT_RGB || state.info_png.color.colortype == LCT_GREY ||
      state.info_png.color.colortype == LCT_GREY_ALPHA) {
    state.info_raw.colortype = LCT_RGBA;
    needs_conversion = true;
  }

  if (state.info_png.color.bitdepth != 8) {
    state.info_raw.bitdepth = 8;
    needs_conversion = true;
  }

  if (needs_conversion) {
    _data.clear();
    state.decoder.color_convert = true;
    error = lodepng::decode(_data, w, h, state, buffer);
    if (error)
      throw std::runtime_error(lodepng_error_text(error));
  }

  _width = w;
  _height = h;

  _src_coord_x = _src_coord_y = 0;

  auto rgba_v = rgba_data();
  _colors = rgba_set_t(rgba_v.begin(), rgba_v.end());
}